

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

size_t jessilib::find<char16_t,char8_t,true>
                 (basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string,
                 basic_string_view<char8_t,_std::char_traits<char8_t>_> in_substring)

{
  size_t sVar1;
  char8_t *pcVar2;
  jessilib *pjVar3;
  jessilib *pjVar4;
  char32_t cVar5;
  char8_t *pcVar6;
  char16_t *pcVar7;
  jessilib *pjVar8;
  jessilib *this;
  jessilib *this_00;
  long lVar9;
  decode_result dVar10;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_01;
  
  pcVar2 = in_substring._M_str;
  pjVar3 = (jessilib *)in_substring._M_len;
  in_string_00._M_len = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  if (pjVar3 == (jessilib *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0xffffffffffffffff;
    if (this != (jessilib *)0x0) {
      if (pjVar3 == (jessilib *)0x1) {
        in_string_00._M_str._0_1_ = *pcVar2;
        in_string_00._M_str._1_7_ = 0;
        sVar1 = find<char16_t,true>(this,in_string_00,(char32_t)in_substring._M_str);
        return sVar1;
      }
      sVar1 = 0;
      pjVar4 = pjVar3;
      pcVar6 = pcVar2;
      this_00 = pjVar3;
      pjVar8 = this;
      pcVar7 = in_string_00._M_len;
LAB_00289a18:
      do {
        cVar5 = (char32_t)(ushort)*in_string_00._M_len;
        lVar9 = 1;
        if (((this != (jessilib *)0x1) && ((cVar5 & 0xfc00U) == 0xd800)) &&
           (((ushort)in_string_00._M_len[1] & 0xfc00) == 0xdc00)) {
          cVar5 = (uint)(ushort)*in_string_00._M_len * 0x400 + (uint)(ushort)in_string_00._M_len[1]
                  + L'\xfca02400';
          lVar9 = 2;
        }
        in_string_01._M_str = (char8_t *)pjVar4;
        in_string_01._M_len = (size_t)pcVar6;
        dVar10 = decode_codepoint_utf8<char8_t>(this_00,in_string_01);
        pjVar4 = (jessilib *)dVar10.units;
        if (pjVar4 == (jessilib *)0x0) break;
        if (cVar5 == dVar10.codepoint) {
          if (this_00 + -(long)pjVar4 == (jessilib *)0x0) {
            return sVar1;
          }
          in_string_00._M_len = in_string_00._M_len + lVar9;
          this = this + -lVar9;
          pcVar6 = pcVar6 + (long)pjVar4;
          this_00 = this_00 + -(long)pjVar4;
          if (this != (jessilib *)0x0) goto LAB_00289a18;
        }
        in_string_00._M_len = pcVar7 + lVar9;
        sVar1 = sVar1 + lVar9;
        this = pjVar8 + -lVar9;
        pjVar4 = pjVar3;
        pcVar6 = pcVar2;
        this_00 = pjVar3;
        pjVar8 = this;
        pcVar7 = in_string_00._M_len;
      } while (this != (jessilib *)0x0);
      sVar1 = 0xffffffffffffffff;
    }
  }
  return sVar1;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}